

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

void dxil_spv::build_exploded_composite_from_vector(Impl *impl,Instruction *value,uint active_lanes)

{
  bool bVar1;
  Id IVar2;
  reference ppVar3;
  Type *pTVar4;
  Operation *pOVar5;
  uint local_74;
  uint i_1;
  Operation *struct_op;
  Operation *ext;
  Id local_58;
  uint i;
  Id extracted [4];
  Id id;
  uint elems;
  pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta> *m;
  Instruction *local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
  local_28;
  iterator itr;
  uint active_lanes_local;
  Instruction *value_local;
  Impl *impl_local;
  
  local_30 = value;
  itr.
  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
  ._M_cur._4_4_ = active_lanes;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
       ::find(&impl->llvm_composite_meta,(key_type *)&local_30);
  m = (pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta> *)
      std::
      unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
      ::end(&impl->llvm_composite_meta);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
                      *)&m);
  if ((!bVar1) &&
     (ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false,_false>
                            *)&local_28), ((ppVar3->second).forced_struct & 1U) != 0)) {
    pTVar4 = LLVMBC::Value::getType(&value->super_Value);
    extracted[3] = LLVMBC::Type::getStructNumElements(pTVar4);
    extracted[2] = Converter::Impl::get_id_for_value(impl,&value->super_Value,0);
    memset(&local_58,0,0x10);
    for (ext._4_4_ = 0;
        ext._4_4_ <
        itr.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
        ._M_cur._4_4_; ext._4_4_ = ext._4_4_ + 1) {
      pTVar4 = LLVMBC::Value::getType(&value->super_Value);
      pTVar4 = LLVMBC::Type::getStructElementType(pTVar4,ext._4_4_);
      IVar2 = Converter::Impl::get_type_id(impl,pTVar4,0);
      pOVar5 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar2);
      Operation::add_id(pOVar5,extracted[2]);
      Operation::add_literal(pOVar5,ext._4_4_);
      Converter::Impl::add(impl,pOVar5,false);
      (&local_58)[ext._4_4_] = pOVar5->id;
    }
    pTVar4 = LLVMBC::Value::getType(&value->super_Value);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar4,0);
    pOVar5 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
    for (local_74 = 0; local_74 < extracted[3]; local_74 = local_74 + 1) {
      if (local_74 <
          itr.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
          ._M_cur._4_4_) {
        Operation::add_id(pOVar5,(&local_58)[local_74]);
      }
      else {
        Operation::add_id(pOVar5,(&local_58)
                                 [itr.
                                  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
                                  ._M_cur._4_4_ - 1]);
      }
    }
    Converter::Impl::add(impl,pOVar5,false);
    Converter::Impl::rewrite_value(impl,&value->super_Value,pOVar5->id);
  }
  return;
}

Assistant:

void build_exploded_composite_from_vector(Converter::Impl &impl, const llvm::Instruction *value, unsigned active_lanes)
{
	auto itr = impl.llvm_composite_meta.find(value);
	if (itr == impl.llvm_composite_meta.end())
		return;

	auto &m = *itr;
	if (m.second.forced_struct)
	{
		// This value will be consumed by something other than plain OpCompositeExtract, force output struct type.
		unsigned elems = value->getType()->getStructNumElements();
		spv::Id id = impl.get_id_for_value(value);

		spv::Id extracted[4] = {};
		for (unsigned i = 0; i < active_lanes; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, impl.get_type_id(value->getType()->getStructElementType(i)));
			ext->add_id(id);
			ext->add_literal(i);
			impl.add(ext);
			extracted[i] = ext->id;
		}

		auto *struct_op = impl.allocate(spv::OpCompositeConstruct, impl.get_type_id(value->getType()));
		for (unsigned i = 0; i < elems; i++)
		{
			if (i < active_lanes)
				struct_op->add_id(extracted[i]);
			else
				struct_op->add_id(extracted[active_lanes - 1]);
		}

		impl.add(struct_op);
		impl.rewrite_value(value, struct_op->id);
	}
}